

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O0

ARKodeSPRKTable arkodeSymplecticSuzukiUmeno816(void)

{
  ARKodeSPRKTable sprk_table;
  int in_stack_ffffffffffffffec;
  ARKodeSPRKTable local_8;
  
  local_8 = ARKodeSPRKTable_Alloc(in_stack_ffffffffffffffec);
  if (local_8 == (ARKodeSPRKTable)0x0) {
    local_8 = (ARKodeSPRKTable)0x0;
  }
  else {
    local_8->q = 8;
    local_8->stages = 0x10;
    *local_8->a = 0.741670364350613;
    local_8->a[1] = -0.4091008258000316;
    local_8->a[2] = 0.1907547102962384;
    local_8->a[3] = -0.5738624711160822;
    local_8->a[4] = 0.2990641813036559;
    local_8->a[5] = 0.33462491824529816;
    local_8->a[6] = 0.3152930923967666;
    local_8->a[7] = -0.7968879393529164;
    local_8->a[8] = local_8->a[6];
    local_8->a[9] = local_8->a[5];
    local_8->a[10] = local_8->a[4];
    local_8->a[0xb] = local_8->a[3];
    local_8->a[0xc] = local_8->a[2];
    local_8->a[0xd] = local_8->a[1];
    local_8->a[0xe] = *local_8->a;
    local_8->a[0xf] = 0.0;
    *local_8->ahat = *local_8->a / 2.0;
    local_8->ahat[1] = (*local_8->a + local_8->a[1]) / 2.0;
    local_8->ahat[2] = (local_8->a[1] + local_8->a[2]) / 2.0;
    local_8->ahat[3] = (local_8->a[2] + local_8->a[3]) / 2.0;
    local_8->ahat[4] = (local_8->a[3] + local_8->a[4]) / 2.0;
    local_8->ahat[5] = (local_8->a[4] + local_8->a[5]) / 2.0;
    local_8->ahat[6] = (local_8->a[5] + local_8->a[6]) / 2.0;
    local_8->ahat[7] = (local_8->a[6] + local_8->a[7]) / 2.0;
    local_8->ahat[8] = local_8->ahat[7];
    local_8->ahat[9] = local_8->ahat[6];
    local_8->ahat[10] = local_8->ahat[5];
    local_8->ahat[0xb] = local_8->ahat[4];
    local_8->ahat[0xc] = local_8->ahat[3];
    local_8->ahat[0xd] = local_8->ahat[2];
    local_8->ahat[0xe] = local_8->ahat[1];
    local_8->ahat[0xf] = *local_8->ahat;
  }
  return local_8;
}

Assistant:

static ARKodeSPRKTable arkodeSymplecticSuzukiUmeno816(void)
{
  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(16);
  if (!sprk_table) { return NULL; }
  sprk_table->q       = 8;
  sprk_table->stages  = 16;
  sprk_table->a[0]    = SUN_RCONST(0.7416703643506129534482278017838063156035);
  sprk_table->a[1]    = -SUN_RCONST(0.4091008258000315939973000958935634173099);
  sprk_table->a[2]    = SUN_RCONST(0.1907547102962383799538762564503716627355);
  sprk_table->a[3]    = -SUN_RCONST(0.5738624711160822666563877266355357421595);
  sprk_table->a[4]    = SUN_RCONST(0.2990641813036559238444635406886029882258);
  sprk_table->a[5]    = SUN_RCONST(0.3346249182452981837849579798821822886337);
  sprk_table->a[6]    = SUN_RCONST(0.3152930923967665966320566638110024309941);
  sprk_table->a[7]    = -SUN_RCONST(0.7968879393529163540197888401737330534463);
  sprk_table->a[8]    = sprk_table->a[6];
  sprk_table->a[9]    = sprk_table->a[5];
  sprk_table->a[10]   = sprk_table->a[4];
  sprk_table->a[11]   = sprk_table->a[3];
  sprk_table->a[12]   = sprk_table->a[2];
  sprk_table->a[13]   = sprk_table->a[1];
  sprk_table->a[14]   = sprk_table->a[0];
  sprk_table->a[15]   = SUN_RCONST(0.0);
  sprk_table->ahat[0] = sprk_table->a[0] / SUN_RCONST(2.0);
  sprk_table->ahat[1] = (sprk_table->a[0] + sprk_table->a[1]) / SUN_RCONST(2.0);
  sprk_table->ahat[2] = (sprk_table->a[1] + sprk_table->a[2]) / SUN_RCONST(2.0);
  sprk_table->ahat[3] = (sprk_table->a[2] + sprk_table->a[3]) / SUN_RCONST(2.0);
  sprk_table->ahat[4] = (sprk_table->a[3] + sprk_table->a[4]) / SUN_RCONST(2.0);
  sprk_table->ahat[5] = (sprk_table->a[4] + sprk_table->a[5]) / SUN_RCONST(2.0);
  sprk_table->ahat[6] = (sprk_table->a[5] + sprk_table->a[6]) / SUN_RCONST(2.0);
  sprk_table->ahat[7] = (sprk_table->a[6] + sprk_table->a[7]) / SUN_RCONST(2.0);
  sprk_table->ahat[8] = sprk_table->ahat[7];
  sprk_table->ahat[9] = sprk_table->ahat[6];
  sprk_table->ahat[10] = sprk_table->ahat[5];
  sprk_table->ahat[11] = sprk_table->ahat[4];
  sprk_table->ahat[12] = sprk_table->ahat[3];
  sprk_table->ahat[13] = sprk_table->ahat[2];
  sprk_table->ahat[14] = sprk_table->ahat[1];
  sprk_table->ahat[15] = sprk_table->ahat[0];
  return sprk_table;
}